

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_frameHeaderSize_internal(void *src,size_t srcSize,ZSTD_format_e format)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  ZSTD_format_e in_EDX;
  ulong in_RSI;
  long in_RDI;
  U32 fcsId;
  U32 singleSegment;
  U32 dictID;
  BYTE fhd;
  size_t minInputSize;
  byte local_39;
  size_t local_8;
  
  sVar3 = ZSTD_startingInputLength(in_EDX);
  if (in_RSI < sVar3) {
    local_8 = 0xffffffffffffffb8;
  }
  else {
    bVar1 = *(byte *)(in_RDI + (sVar3 - 1));
    uVar2 = (int)(uint)bVar1 >> 5 & 1;
    local_39 = 0;
    if (uVar2 != 0) {
      local_39 = (int)(uint)bVar1 >> 6 != 0U ^ 0xff;
    }
    local_8 = sVar3 + (long)(int)(uint)((uVar2 != 0 ^ 0xffU) & 1) + ZSTD_did_fieldSize[bVar1 & 3] +
              ZSTD_fcs_fieldSize[(uint)((int)(uint)bVar1 >> 6)] + (long)(int)(uint)(local_39 & 1);
  }
  return local_8;
}

Assistant:

static size_t ZSTD_frameHeaderSize_internal(const void* src, size_t srcSize, ZSTD_format_e format)
{
    size_t const minInputSize = ZSTD_startingInputLength(format);
    if (srcSize < minInputSize) return ERROR(srcSize_wrong);

    {   BYTE const fhd = ((const BYTE*)src)[minInputSize-1];
        U32 const dictID= fhd & 3;
        U32 const singleSegment = (fhd >> 5) & 1;
        U32 const fcsId = fhd >> 6;
        return minInputSize + !singleSegment
             + ZSTD_did_fieldSize[dictID] + ZSTD_fcs_fieldSize[fcsId]
             + (singleSegment && !fcsId);
    }
}